

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O0

ON__UINT64 __thiscall ON_FileIterator::CurrentItemSize(ON_FileIterator *this)

{
  ON__UINT64 local_18;
  ON__UINT64 file_size;
  ON_FileIterator *this_local;
  
  local_18 = 0;
  if (*(long *)(this + 0x30) != 0) {
    local_18 = *(ON__UINT64 *)(*(long *)(this + 0x30) + 0x1238);
  }
  return local_18;
}

Assistant:

ON__UINT64 ON_FileIterator::CurrentItemSize() const
{
  ON__UINT64 file_size = 0;

  if (nullptr != m_impl)
  {

#if defined(ON_COMPILER_MSC)
    if (0 != m_impl->CurrentFileNameAsPointer())
    {
      file_size = m_impl->m_fd.nFileSizeHigh;
      file_size *= ((ON__UINT64)0xFFFFFFFF);
      file_size += m_impl->m_fd.nFileSizeLow;
    }
#else
    file_size = m_impl->m_current_file_size;
#endif
  }

  return file_size;
}